

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

mzd_local_t * mzd_local_init_ex(uint r,uint c,_Bool clear)

{
  size_t sVar1;
  mzd_local_t *__s;
  byte in_DL;
  uint in_ESI;
  uint in_EDI;
  uchar *buffer;
  size_t alloc_size;
  size_t buffer_size;
  size_t rowstride;
  
  sVar1 = calculate_width((ulong)in_ESI);
  sVar1 = calculate_rowstride(sVar1);
  __s = (mzd_local_t *)aligned_alloc(0x20);
  if ((in_DL & 1) != 0) {
    memset(__s,0,in_EDI * sVar1 * 8 + 0x1f & 0xffffffffffffffe0);
  }
  return __s;
}

Assistant:

mzd_local_t* mzd_local_init_ex(unsigned int r, unsigned int c, bool clear) {
  const size_t rowstride = calculate_rowstride(calculate_width(c));

  const size_t buffer_size = r * rowstride * sizeof(word);
  const size_t alloc_size  = (buffer_size + 31) & ~31;

  /* We always align mzd_local_ts to 32 bytes. Thus the first row is always
   * aligned to 32 bytes as well. For 128 bit and SSE all other rows are then
   * aligned to 16 bytes. */
  unsigned char* buffer = picnic_aligned_alloc(32, alloc_size);
  if (clear) {
    memset(buffer, 0, alloc_size);
  }

  return (mzd_local_t*)buffer;
}